

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Timer.cpp
# Opt level: O1

void __thiscall TimerHeap::downHeap(TimerHeap *this,size_t index)

{
  pointer psVar1;
  pointer psVar2;
  element_type *peVar3;
  element_type *peVar4;
  long lVar5;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var6;
  pointer psVar7;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  long lVar11;
  
  uVar9 = index * 2 + 1;
  psVar7 = (this->timerHeap_).
           super__Vector_base<std::shared_ptr<Timer>,_std::allocator<std::shared_ptr<Timer>_>_>.
           _M_impl.super__Vector_impl_data._M_start;
  uVar10 = (long)(this->timerHeap_).
                 super__Vector_base<std::shared_ptr<Timer>,_std::allocator<std::shared_ptr<Timer>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish - (long)psVar7 >> 4;
  if (uVar9 < uVar10) {
    lVar11 = index * 2;
    do {
      uVar8 = lVar11 + 2;
      if (uVar8 < uVar10) {
        peVar3 = psVar7[uVar8].super___shared_ptr<Timer,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        peVar4 = psVar7[uVar9].super___shared_ptr<Timer,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        lVar11 = (peVar4->timeout_).sec;
        lVar5 = (peVar3->timeout_).sec;
        if ((lVar11 <= lVar5) &&
           ((lVar5 != lVar11 ||
            (*(long *)((long)&peVar4->timeout_ + 8) <= *(long *)((long)&peVar3->timeout_ + 8)))))
        goto LAB_0011dca8;
      }
      else {
LAB_0011dca8:
        uVar8 = uVar9;
      }
      psVar1 = psVar7 + index;
      peVar3 = psVar7[index].super___shared_ptr<Timer,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      psVar2 = psVar7 + uVar8;
      peVar4 = psVar7[uVar8].super___shared_ptr<Timer,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      if ((peVar3->timeout_).sec < (peVar4->timeout_).sec) {
        return;
      }
      if (((peVar3->timeout_).sec == (peVar4->timeout_).sec) &&
         (*(long *)((long)&peVar3->timeout_ + 8) < *(long *)((long)&peVar4->timeout_ + 8))) {
        return;
      }
      (psVar1->super___shared_ptr<Timer,_(__gnu_cxx::_Lock_policy)2>)._M_ptr = peVar4;
      (psVar2->super___shared_ptr<Timer,_(__gnu_cxx::_Lock_policy)2>)._M_ptr = peVar3;
      p_Var6 = (psVar2->super___shared_ptr<Timer,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi;
      (psVar2->super___shared_ptr<Timer,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi =
           (psVar1->super___shared_ptr<Timer,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi;
      (psVar1->super___shared_ptr<Timer,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi = p_Var6;
      lVar11 = uVar8 * 2;
      uVar9 = uVar8 * 2 + 1;
      psVar7 = (this->timerHeap_).
               super__Vector_base<std::shared_ptr<Timer>,_std::allocator<std::shared_ptr<Timer>_>_>.
               _M_impl.super__Vector_impl_data._M_start;
      uVar10 = (long)(this->timerHeap_).
                     super__Vector_base<std::shared_ptr<Timer>,_std::allocator<std::shared_ptr<Timer>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish - (long)psVar7 >> 4;
      index = uVar8;
    } while (uVar9 < uVar10);
  }
  return;
}

Assistant:

void TimerHeap::downHeap(size_t index) {
    size_t child = index * 2 + 1;
    while (child < timerHeap_.size()) {
        if (child + 1 < timerHeap_.size() && timerHeap_[child + 1]->timeout_ < timerHeap_[child]->timeout_) 
            ++child;
        if (timerHeap_[index]->timeout_ < timerHeap_[child]->timeout_) 
            break;
        swapHeap(index, child);
        index = child;
        child = index * 2 + 1;
    }
}